

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeMahonyFilter.cpp
# Opt level: O0

Matrix3x3 *
getAngVelSkewSymmetricMatrixFromMeasurements
          (Vector3 meas,Direction *vectorDir,double confidenceMeas,Rotation *R)

{
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *in_RDI;
  double in_XMM0_Qa;
  RealScalar RVar1;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
  *in_stack_00000008;
  Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *in_stack_00000010;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_00000018;
  Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> S;
  Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> A;
  Matrix3x3 Adyn;
  Vector3 vectorial_estimate;
  Direction va_hat;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffde8;
  size_t in_stack_fffffffffffffdf0;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffdf8;
  VectorFixSize<3U> *in_stack_fffffffffffffe00;
  VectorFixSize<3U> *in_stack_fffffffffffffe08;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *this;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  *in_stack_fffffffffffffe38;
  Vector3 in_stack_fffffffffffffe70;
  Vector3 in_stack_fffffffffffffe88;
  MatrixFixSize<3U,_3U> *local_88;
  MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>_>
  *local_80;
  VectorFixSize<3U> local_30;
  double local_10;
  
  this = in_RDI;
  local_10 = in_XMM0_Qa;
  iDynTree::Rotation::inverse();
  iDynTree::Rotation::changeCoordFrameOf((Direction *)&local_30);
  iDynTree::VectorFixSize<3U>::data(&local_30);
  iDynTree::VectorFixSize<3U>::VectorFixSize
            (in_stack_fffffffffffffe00,(double *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0
            );
  iDynTree::toEigen<3U>(in_stack_fffffffffffffe08);
  RVar1 = Eigen::
          MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
          norm(in_stack_fffffffffffffde8);
  if ((RVar1 != 1.0) || (NAN(RVar1))) {
    iDynTree::toEigen<3U>(in_stack_fffffffffffffe08);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
    normalize(in_stack_fffffffffffffdf8);
  }
  getMatrixFromVectorVectorMultiplication(in_stack_fffffffffffffe70,in_stack_fffffffffffffe88);
  iDynTree::MatrixFixSize<3U,_3U>::MatrixFixSize((MatrixFixSize<3U,_3U> *)this);
  iDynTree::toEigen<3u,3u>(local_88);
  iDynTree::toEigen<3u,3u>(local_88);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>::
  transpose(in_stack_00000018);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>::operator-
            (this,local_80);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>const,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>const>>
  ::operator*(in_stack_fffffffffffffe38,(double *)(local_10 * 0.5));
  Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>::operator=
            (in_stack_00000010,in_stack_00000008);
  return (Matrix3x3 *)in_RDI;
}

Assistant:

iDynTree::Matrix3x3 getAngVelSkewSymmetricMatrixFromMeasurements(iDynTree::Vector3 meas, const iDynTree::Direction& vectorDir, double confidenceMeas, const iDynTree::Rotation& R)
{
    using iDynTree::toEigen;

    ///< compute \f$ {{^A}{\hat{R}}_B}^T e_3 \f$ where \f$ e_3 \f$ is the vectorDir
    iDynTree::Direction va_hat = R.inverse().changeCoordFrameOf(vectorDir);
    iDynTree::Vector3 vectorial_estimate = iDynTree::Vector3(va_hat.data(), 3);

    ///< compute vectorial direction from the measurement normalized
    if (toEigen(meas).norm() != 1)
    {
        toEigen(meas).normalize();
    }

    iDynTree::Matrix3x3 Adyn = getMatrixFromVectorVectorMultiplication(meas, vectorial_estimate);
    iDynTree::Matrix3x3 Sdyn;
    auto A(toEigen(Adyn));
    auto S(toEigen(Sdyn));

    S = (A - A.transpose())*(confidenceMeas*0.5);

    return Sdyn;
}